

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O0

void WI_Start(wbstartstruct_t *wbstartstruct)

{
  int iVar1;
  wbstartstruct_t *wbstartstruct_local;
  
  noautostartmap = false;
  V_SetBlend(0,0,0,0);
  WI_initVariables(wbstartstruct);
  WI_loadData();
  iVar1 = FIntCVar::operator_cast_to_int(&deathmatch);
  if (iVar1 == 0) {
    if ((multiplayer & 1U) == 0) {
      WI_initStats();
    }
    else {
      WI_initNetgameStats();
    }
  }
  else {
    WI_initDeathmatchStats();
  }
  S_StopAllChannels();
  SN_StopAllSequences();
  return;
}

Assistant:

void WI_Start (wbstartstruct_t *wbstartstruct)
{
	noautostartmap = false;
	V_SetBlend (0,0,0,0);
	WI_initVariables (wbstartstruct);
	WI_loadData ();
	if (deathmatch)
		WI_initDeathmatchStats();
	else if (multiplayer)
		WI_initNetgameStats();
	else
		WI_initStats();
	S_StopAllChannels ();
	SN_StopAllSequences ();
}